

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

void __thiscall
httplib::Server::apply_ranges
          (Server *this,Request *req,Response *res,string *content_type,string *boundary)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  pointer ppVar4;
  ulong uVar5;
  _Invoker_type p_Var6;
  pointer pcVar7;
  undefined8 uVar8;
  string *in_RCX;
  _Base_ptr in_RDX;
  Request *in_RSI;
  string *in_R8;
  string length_1;
  string compressed;
  string content_encoding;
  unique_ptr<httplib::detail::compressor,_std::default_delete<httplib::detail::compressor>_>
  compressor;
  string data;
  string content_range_1;
  unsigned_long length_2;
  unsigned_long offset_1;
  pair<unsigned_long,_unsigned_long> offsets_1;
  string content_range;
  unsigned_long offset;
  pair<unsigned_long,_unsigned_long> offsets;
  size_t length;
  EncodingType type;
  iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffad8;
  string *in_stack_fffffffffffffae0;
  string *val;
  iterator in_stack_fffffffffffffae8;
  Response *in_stack_fffffffffffffaf0;
  string *in_stack_fffffffffffffaf8;
  string *this_00;
  string *in_stack_fffffffffffffb00;
  Response *in_stack_fffffffffffffb08;
  Request *in_stack_fffffffffffffb10;
  Response *in_stack_fffffffffffffb18;
  undefined7 in_stack_fffffffffffffb20;
  byte in_stack_fffffffffffffb27;
  char *in_stack_fffffffffffffb28;
  undefined7 in_stack_fffffffffffffb30;
  undefined1 in_stack_fffffffffffffb37;
  size_t in_stack_fffffffffffffb38;
  _Invoker_type p_Var9;
  Request *in_stack_fffffffffffffb40;
  size_t in_stack_fffffffffffffb68;
  size_t in_stack_fffffffffffffb70;
  size_t in_stack_fffffffffffffb78;
  Response *in_stack_fffffffffffffbb0;
  Request *in_stack_fffffffffffffbb8;
  undefined1 local_3f1 [33];
  string local_3d0 [39];
  undefined1 local_3a9 [33];
  string *local_388;
  undefined1 local_380 [64];
  string local_340 [40];
  string local_318 [32];
  string local_2f8 [39];
  allocator<char> local_2d1;
  string local_2d0 [32];
  string local_2b0 [32];
  _Manager_type local_290;
  _Invoker_type local_288;
  pair<unsigned_long,_unsigned_long> local_280;
  allocator<char> local_269;
  string local_268 [39];
  allocator<char> local_241;
  string local_240 [39];
  allocator<char> local_219;
  string local_218 [39];
  allocator<char> local_1f1;
  string local_1f0 [39];
  allocator<char> local_1c9;
  string local_1c8 [39];
  allocator<char> local_1a1;
  string local_1a0 [32];
  string local_180 [39];
  allocator<char> local_159;
  string local_158 [39];
  allocator<char> local_131;
  string local_130 [32];
  string local_110 [32];
  unsigned_long local_f0;
  pair<unsigned_long,_unsigned_long> local_e8;
  _Base_ptr local_d8;
  EncodingType local_cc;
  _Base_ptr local_c8;
  string local_c0 [32];
  _Base_ptr local_a0;
  _Base_ptr local_98;
  _Self local_90 [3];
  allocator<char> local_71;
  string local_70 [32];
  _Self local_50;
  string local_48 [32];
  string *local_28;
  string *local_20;
  _Base_ptr local_18;
  Request *local_10;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  sVar3 = std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::size
                    (&in_RSI->ranges);
  if (1 < sVar3) {
    detail::make_multipart_data_boundary_abi_cxx11_();
    std::__cxx11::string::operator=(local_28,local_48);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20),
               (char *)in_stack_fffffffffffffb18,(allocator<char> *)in_stack_fffffffffffffb10);
    local_50._M_node =
         (_Base_ptr)
         std::
         multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)in_stack_fffffffffffffad8,(key_type *)0x1cda10);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator(&local_71);
    local_90[0]._M_node =
         (_Base_ptr)
         std::
         multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffffad8);
    bVar1 = std::operator!=(&local_50,local_90);
    if (bVar1) {
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)0x1cda88);
      std::__cxx11::string::operator=(local_20,(string *)&ppVar4->second);
      local_98 = local_50._M_node;
      local_a0 = (_Base_ptr)
                 std::
                 multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                 ::erase_abi_cxx11_((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)in_stack_fffffffffffffae0,in_stack_fffffffffffffae8);
    }
    std::operator+(in_stack_fffffffffffffb28,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20));
    local_c8 = (_Base_ptr)
               std::
               multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
               ::emplace<char_const(&)[13],std::__cxx11::string>
                         (in_stack_fffffffffffffae8._M_node,(char (*) [13])in_stack_fffffffffffffae0
                          ,in_stack_fffffffffffffad8);
    std::__cxx11::string::~string(local_c0);
  }
  local_cc = detail::encoding_type(in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    bVar1 = std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::empty
                      ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
                       in_stack_fffffffffffffaf0);
    if (!bVar1) {
      sVar3 = std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::size
                        (&local_10->ranges);
      if (sVar3 == 1) {
        std::__cxx11::string::size();
        local_280 = detail::get_range_offset_and_length
                              (local_10,in_stack_fffffffffffffb38,
                               CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30));
        local_288 = (_Invoker_type)local_280.first;
        local_290 = (_Manager_type)local_280.second;
        std::__cxx11::string::size();
        detail::make_content_range_header_field_abi_cxx11_
                  (in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20),
                   (char *)in_stack_fffffffffffffb18,(allocator<char> *)in_stack_fffffffffffffb10);
        Response::set_header
                  (in_stack_fffffffffffffaf0,(string *)in_stack_fffffffffffffae8._M_node,
                   in_stack_fffffffffffffae0);
        std::__cxx11::string::~string(local_2d0);
        std::allocator<char>::~allocator(&local_2d1);
        p_Var9 = local_288;
        p_Var6 = (_Invoker_type)std::__cxx11::string::size();
        if (p_Var9 < p_Var6) {
          std::__cxx11::string::substr((ulong)local_2f8,(ulong)&local_18[3]._M_right);
          std::__cxx11::string::operator=((string *)&local_18[3]._M_right,local_2f8);
          std::__cxx11::string::~string(local_2f8);
        }
        else {
          std::__cxx11::string::clear();
          local_18[1]._M_color = 0x1a0;
        }
        std::__cxx11::string::~string(local_2b0);
      }
      else {
        std::__cxx11::string::string(local_318);
        bVar1 = detail::make_multipart_ranges_data
                          ((Request *)CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20),
                           in_stack_fffffffffffffb18,&in_stack_fffffffffffffb10->method,
                           &in_stack_fffffffffffffb08->version,in_stack_fffffffffffffb00);
        if (bVar1) {
          std::__cxx11::string::swap((string *)&local_18[3]._M_right);
        }
        else {
          std::__cxx11::string::clear();
          local_18[1]._M_color = 0x1a0;
        }
        std::__cxx11::string::~string(local_318);
      }
    }
    if (local_cc != None) {
      std::unique_ptr<httplib::detail::compressor,std::default_delete<httplib::detail::compressor>>
      ::unique_ptr<std::default_delete<httplib::detail::compressor>,void>
                ((unique_ptr<httplib::detail::compressor,_std::default_delete<httplib::detail::compressor>_>
                  *)in_stack_fffffffffffffae0);
      std::__cxx11::string::string(local_340);
      bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<httplib::detail::compressor,_std::default_delete<httplib::detail::compressor>_>
                          *)0x1ce6b9);
      if (bVar1) {
        this_00 = (string *)(local_380 + 0x20);
        std::__cxx11::string::string(this_00);
        pcVar7 = std::
                 unique_ptr<httplib::detail::compressor,_std::default_delete<httplib::detail::compressor>_>
                 ::operator->((unique_ptr<httplib::detail::compressor,_std::default_delete<httplib::detail::compressor>_>
                               *)0x1ce6e1);
        uVar8 = std::__cxx11::string::data();
        in_stack_fffffffffffffb10 = (Request *)std::__cxx11::string::size();
        in_stack_fffffffffffffb18 = (Response *)local_380;
        local_388 = this_00;
        std::function<bool(char_const*,unsigned_long)>::
        function<httplib::Server::apply_ranges(httplib::Request_const&,httplib::Response&,std::__cxx11::string&,std::__cxx11::string&)::_lambda(char_const*,unsigned_long)_1_,void>
                  ((function<bool_(const_char_*,_unsigned_long)> *)in_stack_fffffffffffffaf0,
                   (anon_class_8_1_8772f13f *)in_stack_fffffffffffffae8._M_node);
        iVar2 = (*pcVar7->_vptr_compressor[2])
                          (pcVar7,uVar8,in_stack_fffffffffffffb10,1,in_stack_fffffffffffffb18);
        in_stack_fffffffffffffb27 = (byte)iVar2;
        std::function<bool_(const_char_*,_unsigned_long)>::~function
                  ((function<bool_(const_char_*,_unsigned_long)> *)0x1ce771);
        if ((in_stack_fffffffffffffb27 & 1) != 0) {
          std::__cxx11::string::swap((string *)&local_18[3]._M_right);
          in_stack_fffffffffffffaf0 = (Response *)local_3a9;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20),
                     (char *)in_stack_fffffffffffffb18,(allocator<char> *)in_stack_fffffffffffffb10)
          ;
          Response::set_header
                    (in_stack_fffffffffffffaf0,(string *)local_18,in_stack_fffffffffffffae0);
          std::__cxx11::string::~string((string *)(local_3a9 + 1));
          std::allocator<char>::~allocator((allocator<char> *)local_3a9);
          in_stack_fffffffffffffae8._M_node = local_18;
        }
        std::__cxx11::string::~string((string *)(local_380 + 0x20));
      }
      std::__cxx11::string::~string(local_340);
      std::
      unique_ptr<httplib::detail::compressor,_std::default_delete<httplib::detail::compressor>_>::
      ~unique_ptr((unique_ptr<httplib::detail::compressor,_std::default_delete<httplib::detail::compressor>_>
                   *)in_stack_fffffffffffffae0);
    }
    std::__cxx11::string::size();
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffb18);
    val = (string *)local_3f1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20),
               (char *)in_stack_fffffffffffffb18,(allocator<char> *)in_stack_fffffffffffffb10);
    Response::set_header(in_stack_fffffffffffffaf0,(string *)in_stack_fffffffffffffae8._M_node,val);
    std::__cxx11::string::~string((string *)(local_3f1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_3f1);
    std::__cxx11::string::~string(local_3d0);
  }
  else if (local_18[5]._M_right == (_Base_ptr)0x0) {
    bVar1 = std::function::operator_cast_to_bool
                      ((function<bool_(unsigned_long,_unsigned_long,_httplib::DataSink_&)> *)
                       in_stack_fffffffffffffae0);
    if ((bVar1) && ((local_18[8]._M_color & _S_black) != _S_red)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20),
                 (char *)in_stack_fffffffffffffb18,(allocator<char> *)in_stack_fffffffffffffb10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20),
                 (char *)in_stack_fffffffffffffb18,(allocator<char> *)in_stack_fffffffffffffb10);
      Response::set_header
                (in_stack_fffffffffffffaf0,(string *)in_stack_fffffffffffffae8._M_node,
                 in_stack_fffffffffffffae0);
      std::__cxx11::string::~string(local_1c8);
      std::allocator<char>::~allocator(&local_1c9);
      std::__cxx11::string::~string(local_1a0);
      std::allocator<char>::~allocator(&local_1a1);
      if (local_cc == Gzip) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20),
                   (char *)in_stack_fffffffffffffb18,(allocator<char> *)in_stack_fffffffffffffb10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20),
                   (char *)in_stack_fffffffffffffb18,(allocator<char> *)in_stack_fffffffffffffb10);
        Response::set_header
                  (in_stack_fffffffffffffaf0,(string *)in_stack_fffffffffffffae8._M_node,
                   in_stack_fffffffffffffae0);
        std::__cxx11::string::~string(local_218);
        std::allocator<char>::~allocator(&local_219);
        std::__cxx11::string::~string(local_1f0);
        std::allocator<char>::~allocator(&local_1f1);
      }
      else if (local_cc == Brotli) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20),
                   (char *)in_stack_fffffffffffffb18,(allocator<char> *)in_stack_fffffffffffffb10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20),
                   (char *)in_stack_fffffffffffffb18,(allocator<char> *)in_stack_fffffffffffffb10);
        Response::set_header
                  (in_stack_fffffffffffffaf0,(string *)in_stack_fffffffffffffae8._M_node,
                   in_stack_fffffffffffffae0);
        std::__cxx11::string::~string(local_268);
        std::allocator<char>::~allocator(&local_269);
        std::__cxx11::string::~string(local_240);
        std::allocator<char>::~allocator(&local_241);
      }
    }
  }
  else {
    local_d8 = (_Base_ptr)0x0;
    bVar1 = std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::empty
                      ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
                       in_stack_fffffffffffffaf0);
    if (bVar1) {
      local_d8 = local_18[5]._M_right;
    }
    else {
      sVar3 = std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::size
                        (&local_10->ranges);
      if (sVar3 == 1) {
        local_e8 = detail::get_range_offset_and_length
                             (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,
                              CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30));
        local_f0 = local_e8.first;
        local_d8 = (_Base_ptr)local_e8.second;
        detail::make_content_range_header_field_abi_cxx11_
                  (in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20),
                   (char *)in_stack_fffffffffffffb18,(allocator<char> *)in_stack_fffffffffffffb10);
        Response::set_header
                  (in_stack_fffffffffffffaf0,(string *)in_stack_fffffffffffffae8._M_node,
                   in_stack_fffffffffffffae0);
        std::__cxx11::string::~string(local_130);
        std::allocator<char>::~allocator(&local_131);
        std::__cxx11::string::~string(local_110);
      }
      else {
        local_d8 = (_Base_ptr)
                   detail::get_multipart_ranges_data_length
                             (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,
                              in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20),
               (char *)in_stack_fffffffffffffb18,(allocator<char> *)in_stack_fffffffffffffb10);
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffb18);
    Response::set_header
              (in_stack_fffffffffffffaf0,(string *)in_stack_fffffffffffffae8._M_node,
               in_stack_fffffffffffffae0);
    std::__cxx11::string::~string(local_180);
    std::__cxx11::string::~string(local_158);
    std::allocator<char>::~allocator(&local_159);
  }
  return;
}

Assistant:

inline void Server::apply_ranges(const Request& req, Response& res,
        std::string& content_type,
        std::string& boundary) {
        if (req.ranges.size() > 1) {
            boundary = detail::make_multipart_data_boundary();

            auto it = res.headers.find("Content-Type");
            if (it != res.headers.end()) {
                content_type = it->second;
                res.headers.erase(it);
            }

            res.headers.emplace("Content-Type",
                "multipart/byteranges; boundary=" + boundary);
        }

        auto type = detail::encoding_type(req, res);

        if (res.body.empty()) {
            if (res.content_length_ > 0) {
                size_t length = 0;
                if (req.ranges.empty()) {
                    length = res.content_length_;
                } else if (req.ranges.size() == 1) {
                    auto offsets =
                        detail::get_range_offset_and_length(req, res.content_length_, 0);
                    auto offset = offsets.first;
                    length = offsets.second;
                    auto content_range = detail::make_content_range_header_field(
                        offset, length, res.content_length_);
                    res.set_header("Content-Range", content_range);
                } else {
                    length = detail::get_multipart_ranges_data_length(req, res, boundary,
                        content_type);
                }
                res.set_header("Content-Length", std::to_string(length));
            } else {
                if (res.content_provider_) {
                    if (res.is_chunked_content_provider_) {
                        res.set_header("Transfer-Encoding", "chunked");
                        if (type == detail::EncodingType::Gzip) {
                            res.set_header("Content-Encoding", "gzip");
                        } else if (type == detail::EncodingType::Brotli) {
                            res.set_header("Content-Encoding", "br");
                        }
                    }
                }
            }
        } else {
            if (req.ranges.empty()) {
                ;
            } else if (req.ranges.size() == 1) {
                auto offsets =
                    detail::get_range_offset_and_length(req, res.body.size(), 0);
                auto offset = offsets.first;
                auto length = offsets.second;
                auto content_range = detail::make_content_range_header_field(
                    offset, length, res.body.size());
                res.set_header("Content-Range", content_range);
                if (offset < res.body.size()) {
                    res.body = res.body.substr(offset, length);
                } else {
                    res.body.clear();
                    res.status = 416;
                }
            } else {
                std::string data;
                if (detail::make_multipart_ranges_data(req, res, boundary, content_type,
                    data)) {
                    res.body.swap(data);
                } else {
                    res.body.clear();
                    res.status = 416;
                }
            }

            if (type != detail::EncodingType::None) {
                std::unique_ptr<detail::compressor> compressor;
                std::string content_encoding;

                if (type == detail::EncodingType::Gzip) {
                #ifdef CPPHTTPLIB_ZLIB_SUPPORT
                    compressor = detail::make_unique<detail::gzip_compressor>();
                    content_encoding = "gzip";
                #endif
                } else if (type == detail::EncodingType::Brotli) {
                #ifdef CPPHTTPLIB_BROTLI_SUPPORT
                    compressor = detail::make_unique<detail::brotli_compressor>();
                    content_encoding = "br";
                #endif
                }

                if (compressor) {
                    std::string compressed;
                    if (compressor->compress(res.body.data(), res.body.size(), true,
                        [&](const char* data, size_t data_len) {
                        compressed.append(data, data_len);
                        return true;
                    })) {
                        res.body.swap(compressed);
                        res.set_header("Content-Encoding", content_encoding);
                    }
                }
            }

            auto length = std::to_string(res.body.size());
            res.set_header("Content-Length", length);
        }
    }